

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall
helics::CommonCore::getErrorMessage_abi_cxx11_(string *__return_storage_ptr__,CommonCore *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,&(this->super_BrokerBase).lastErrorString);
  return __return_storage_ptr__;
}

Assistant:

std::string CommonCore::getErrorMessage() const
{
    // used to sync threads and ensure a string is available
    (void)lastErrorCode.load();
    return lastErrorString;
}